

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_info.c
# Opt level: O0

int readline(char *allbuf,int level,char *linebuf)

{
  size_t sVar1;
  char *pcStack_28;
  int len;
  char *linebuf_local;
  int level_local;
  char *allbuf_local;
  
  sVar1 = strlen(allbuf);
  pcStack_28 = linebuf;
  linebuf_local._4_4_ = level;
  while( true ) {
    if ((int)sVar1 <= linebuf_local._4_4_) {
      return -1;
    }
    if ((allbuf[linebuf_local._4_4_] == '\r') && (allbuf[linebuf_local._4_4_ + 1] == '\n')) break;
    *pcStack_28 = allbuf[linebuf_local._4_4_];
    linebuf_local._4_4_ = linebuf_local._4_4_ + 1;
    pcStack_28 = pcStack_28 + 1;
  }
  return linebuf_local._4_4_ + 2;
}

Assistant:

int readline(char* allbuf,int level,char* linebuf){
    int len = strlen(allbuf);
    for (;level<len;++level)
    {
        if(allbuf[level]=='\r' && allbuf[level+1]=='\n')
            return level+2;
        else
            *(linebuf++) = allbuf[level];
    }
    return -1;
}